

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O2

void free_extra_descr(EXTRA_DESCR_DATA *ed)

{
  if ((ed != (EXTRA_DESCR_DATA *)0x0) && (ed->valid == true)) {
    free_pstring(ed->keyword);
    free_pstring(ed->description);
    ed->valid = false;
    ed->next = extra_descr_free;
    extra_descr_free = ed;
  }
  return;
}

Assistant:

void free_extra_descr(EXTRA_DESCR_DATA *ed)
{
	if (!(ed != nullptr && ed->valid))
		return;

	free_pstring(ed->keyword);
	free_pstring(ed->description);

	ed->valid = false;
	ed->next = extra_descr_free;
	extra_descr_free = ed;
}